

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O0

Vector * __thiscall Box::find_normal(Vector *__return_storage_ptr__,Box *this,Vector *p)

{
  double dVar1;
  Vector local_80;
  Vector local_68;
  int local_4c;
  double dStack_48;
  int i;
  double Dist2;
  double Dist1;
  double d;
  double dStack_28;
  int index;
  double MinDist;
  Vector *p_local;
  Box *this_local;
  Vector *normal;
  
  dStack_28 = INFINITY;
  d._4_4_ = 0;
  MinDist = (double)p;
  p_local = (Vector *)this;
  this_local = (Box *)__return_storage_ptr__;
  Vector::Vector(__return_storage_ptr__);
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    Dist1 = operator&((Vector *)MinDist,this->n + local_4c);
    Dist2 = ABS(Dist1 + this->d1[local_4c]);
    dStack_48 = ABS(Dist1 + this->d2[local_4c]);
    if (Dist2 < dStack_28) {
      d._4_4_ = local_4c;
      dStack_28 = Dist2;
    }
    if (dStack_48 < dStack_28) {
      d._4_4_ = local_4c;
      dStack_28 = dStack_48;
    }
  }
  Vector::operator=(__return_storage_ptr__,this->n + d._4_4_);
  operator-(&local_68,(Vector *)MinDist,&this->center);
  dVar1 = operator&(&local_68,__return_storage_ptr__);
  if (dVar1 < 0.0) {
    Vector::operator-(&local_80,__return_storage_ptr__);
    Vector::operator=(__return_storage_ptr__,&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector Box::find_normal( Vector& p )
{
    double MinDist = INFINITY;
    int index = 0;
    double d,Dist1,Dist2;
    Vector normal;
    int i;

    for( i = 0; i < 3; i++ )
    {
        d = p & n[i];
        Dist1 = fabs(d + d1[i]);
        Dist2 = fabs(d + d2[i]);

        if( Dist1 < MinDist )
        {
            MinDist = Dist1;
            index = i;
        }
        if( Dist2 < MinDist )
        {
            MinDist = Dist2;
            index = i;
        }
    }
    normal = n[index];
    if( ((p - center) & normal) < 0.0 )
        normal = -normal;

    return normal;
}